

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O0

qint64 __thiscall QNetworkDiskCache::expire(QNetworkDiskCache *this)

{
  byte bVar1;
  bool bVar2;
  QFlags<QDirListing::IteratorFlag> QVar3;
  QNetworkDiskCachePrivate *pQVar4;
  qint64 qVar5;
  ulong uVar6;
  long lVar7;
  iterator iVar8;
  iterator iVar9;
  reference pCVar10;
  long in_FS_OFFSET;
  QLatin1StringView QVar11;
  CacheItem *cached;
  vector<CacheItem,_std::allocator<CacheItem>_> *__range1_1;
  int removedFiles;
  qint64 goal;
  qint64 size;
  QFileInfo *info;
  value_type *dirEntry;
  QDirListing *__range1;
  qint64 totalSize;
  QNetworkDiskCachePrivate *d;
  iterator __end1_1;
  iterator __begin1_1;
  anon_class_1_0_00000001 byFileTime;
  milliseconds msecs;
  QDateTime fileTime;
  sentinel __end1;
  const_iterator __begin1;
  vector<CacheItem,_std::allocator<CacheItem>_> cacheItems;
  value_type *in_stack_fffffffffffffe28;
  QCacheItem *in_stack_fffffffffffffe30;
  QCacheItem *this_00;
  QCacheItem *in_stack_fffffffffffffe38;
  undefined6 in_stack_fffffffffffffe40;
  byte in_stack_fffffffffffffe46;
  long local_138;
  qint64 local_120;
  __normal_iterator<CacheItem_*,_std::vector<CacheItem,_std::allocator<CacheItem>_>_> local_110;
  undefined1 local_101;
  undefined8 local_100;
  long local_e0;
  longlong local_d8;
  undefined8 local_d0;
  QTimeZone local_c8;
  QDateTime local_c0 [8];
  QTimeZone local_b8;
  undefined8 local_b0;
  QCacheItem local_a8;
  undefined1 local_81;
  const_iterator local_80;
  undefined1 local_78 [24];
  QDirListing local_60 [8];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  char local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QNetworkDiskCache *)0x282cd6);
  if ((pQVar4->currentCacheSize < 0) ||
     (lVar7 = pQVar4->currentCacheSize,
     qVar5 = maximumCacheSize((QNetworkDiskCache *)in_stack_fffffffffffffe30), qVar5 <= lVar7)) {
    cacheDirectory((QNetworkDiskCache *)in_stack_fffffffffffffe38);
    bVar1 = QString::isEmpty((QString *)0x282d56);
    QString::~QString((QString *)0x282d67);
    if ((bVar1 & 1) == 0) {
      QCacheItem::reset(in_stack_fffffffffffffe30);
      local_58 = 0xaaaaaaaaaaaaaaaa;
      local_50 = 0xaaaaaaaaaaaaaaaa;
      local_48 = 0xaaaaaaaaaaaaaaaa;
      std::vector<CacheItem,_std::allocator<CacheItem>_>::vector
                ((vector<CacheItem,_std::allocator<CacheItem>_> *)0x282df9);
      local_138 = 0;
      cacheDirectory((QNetworkDiskCache *)in_stack_fffffffffffffe38);
      QVar3 = ::operator|((enum_type)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                          (enum_type)in_stack_fffffffffffffe30);
      QDirListing::QDirListing
                (local_60,(QString *)local_78,
                 (QFlags_conflict *)
                 (ulong)(uint)QVar3.super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                              super_QFlagsStorage<QDirListing::IteratorFlag>.i);
      QString::~QString((QString *)0x282e68);
      local_80.dirEntry.dirListPtr = (DirEntry)(QDirListingPrivate *)0xaaaaaaaaaaaaaaaa;
      local_80.dirEntry.dirListPtr = (DirEntry)QDirListing::begin();
      local_81 = 0xaa;
      QDirListing::end(local_60);
      while (bVar2 = ::operator!=(&local_80), bVar2) {
        QDirListing::const_iterator::operator*(&local_80);
        QDirListing::DirEntry::fileName();
        QVar11 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30);
        in_stack_fffffffffffffe46 =
             QString::endsWith((QLatin1String *)&local_a8.data,(CaseSensitivity)QVar11.m_size);
        in_stack_fffffffffffffe46 = in_stack_fffffffffffffe46 ^ 0xff;
        QString::~QString((QString *)0x282f65);
        if ((in_stack_fffffffffffffe46 & 1) == 0) {
          QDirListing::DirEntry::fileInfo();
          this_00 = &local_a8;
          local_b0 = 0xaaaaaaaaaaaaaaaa;
          in_stack_fffffffffffffe38 = this_00;
          QTimeZone::QTimeZone
                    ((QTimeZone *)in_stack_fffffffffffffe30,
                     (Initialization)((ulong)in_stack_fffffffffffffe28 >> 0x20));
          QFileInfo::birthTime
                    ((QFileInfo *)in_stack_fffffffffffffe38,(QTimeZone *)in_stack_fffffffffffffe30);
          QTimeZone::~QTimeZone(&local_b8);
          uVar6 = QDateTime::isValid();
          if ((uVar6 & 1) == 0) {
            QTimeZone::QTimeZone
                      ((QTimeZone *)this_00,
                       (Initialization)((ulong)in_stack_fffffffffffffe28 >> 0x20));
            QFileInfo::metadataChangeTime
                      ((QFileInfo *)in_stack_fffffffffffffe38,(QTimeZone *)this_00);
            QDateTime::operator=((QDateTime *)this_00,(QDateTime *)in_stack_fffffffffffffe28);
            QDateTime::~QDateTime(local_c0);
            QTimeZone::~QTimeZone(&local_c8);
            in_stack_fffffffffffffe30 = this_00;
          }
          local_d0 = 0xaaaaaaaaaaaaaaaa;
          local_d8 = QDateTime::toMSecsSinceEpoch();
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long_long,void>
                    ((duration<long,std::ratio<1l,1000l>> *)&local_d0,&local_d8);
          lVar7 = QFileInfo::size();
          local_100 = local_d0;
          QFileInfo::filePath();
          local_e0 = lVar7;
          std::vector<CacheItem,_std::allocator<CacheItem>_>::push_back
                    ((vector<CacheItem,_std::allocator<CacheItem>_> *)in_stack_fffffffffffffe30,
                     in_stack_fffffffffffffe28);
          expire::CacheItem::~CacheItem((CacheItem *)0x28310a);
          local_138 = lVar7 + local_138;
          QDateTime::~QDateTime((QDateTime *)&local_b0);
          QFileInfo::~QFileInfo((QFileInfo *)&local_a8);
        }
        QDirListing::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffe28);
      }
      QDirListing::~QDirListing(local_60);
      qVar5 = maximumCacheSize((QNetworkDiskCache *)in_stack_fffffffffffffe30);
      lVar7 = (qVar5 * 9) / 10;
      if (lVar7 <= local_138) {
        local_101 = 0xaa;
        iVar8 = std::vector<CacheItem,_std::allocator<CacheItem>_>::begin
                          ((vector<CacheItem,_std::allocator<CacheItem>_> *)
                           in_stack_fffffffffffffe30);
        iVar9 = std::vector<CacheItem,_std::allocator<CacheItem>_>::end
                          ((vector<CacheItem,_std::allocator<CacheItem>_> *)
                           in_stack_fffffffffffffe30);
        std::
        sort<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,QNetworkDiskCache::expire()::__0>
                  (iVar8._M_current,iVar9._M_current);
        local_110._M_current = (CacheItem *)0xaaaaaaaaaaaaaaaa;
        local_110._M_current =
             (CacheItem *)
             std::vector<CacheItem,_std::allocator<CacheItem>_>::begin
                       ((vector<CacheItem,_std::allocator<CacheItem>_> *)in_stack_fffffffffffffe30);
        std::vector<CacheItem,_std::allocator<CacheItem>_>::end
                  ((vector<CacheItem,_std::allocator<CacheItem>_> *)in_stack_fffffffffffffe30);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<CacheItem_*,_std::vector<CacheItem,_std::allocator<CacheItem>_>_>
                                   *)in_stack_fffffffffffffe30,
                                  (__normal_iterator<CacheItem_*,_std::vector<CacheItem,_std::allocator<CacheItem>_>_>
                                   *)in_stack_fffffffffffffe28), bVar2) {
          pCVar10 = __gnu_cxx::
                    __normal_iterator<CacheItem_*,_std::vector<CacheItem,_std::allocator<CacheItem>_>_>
                    ::operator*(&local_110);
          QFile::remove((QString *)&pCVar10->path);
          local_138 = local_138 - pCVar10->size;
          if (local_138 < lVar7) break;
          __gnu_cxx::
          __normal_iterator<CacheItem_*,_std::vector<CacheItem,_std::allocator<CacheItem>_>_>::
          operator++(&local_110);
        }
      }
      std::vector<CacheItem,_std::allocator<CacheItem>_>::~vector
                ((vector<CacheItem,_std::allocator<CacheItem>_> *)
                 CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
      local_120 = local_138;
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)
                 CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                 (char *)in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                 (char *)in_stack_fffffffffffffe28);
      QMessageLogger::warning(local_40,"QNetworkDiskCache::expire() The cache directory is not set")
      ;
      local_120 = 0;
    }
  }
  else {
    local_120 = pQVar4->currentCacheSize;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_120;
}

Assistant:

qint64 QNetworkDiskCache::expire()
{
    Q_D(QNetworkDiskCache);
    if (d->currentCacheSize >= 0 && d->currentCacheSize < maximumCacheSize())
        return d->currentCacheSize;

    if (cacheDirectory().isEmpty()) {
        qWarning("QNetworkDiskCache::expire() The cache directory is not set");
        return 0;
    }

    // close file handle to prevent "in use" error when QFile::remove() is called
    d->lastItem.reset();

    struct CacheItem
    {
        std::chrono::milliseconds msecs;
        QString path;
        qint64 size = 0;
    };
    std::vector<CacheItem> cacheItems;
    qint64 totalSize = 0;
    using F = QDirListing::IteratorFlag;
    for (const auto &dirEntry : QDirListing(cacheDirectory(), F::FilesOnly | F::Recursive)) {
        if (!dirEntry.fileName().endsWith(CACHE_POSTFIX))
            continue;

        const QFileInfo &info = dirEntry.fileInfo();
        QDateTime fileTime = info.birthTime(QTimeZone::UTC);
        if (!fileTime.isValid())
            fileTime = info.metadataChangeTime(QTimeZone::UTC);
        const std::chrono::milliseconds msecs{fileTime.toMSecsSinceEpoch()};
        const qint64 size = info.size();
        cacheItems.push_back(CacheItem{msecs, info.filePath(), size});
        totalSize += size;
    }

    const qint64 goal = (maximumCacheSize() * 9) / 10;
    if (totalSize < goal)
        return totalSize; // Nothing to do

    auto byFileTime = [&](const auto &a, const auto &b) { return a.msecs < b.msecs; };
    std::sort(cacheItems.begin(), cacheItems.end(), byFileTime);

    [[maybe_unused]] int removedFiles = 0; // used under QNETWORKDISKCACHE_DEBUG
    for (const CacheItem &cached : cacheItems) {
        QFile::remove(cached.path);
        ++removedFiles;
        totalSize -= cached.size;
        if (totalSize < goal)
            break;
    }
#if defined(QNETWORKDISKCACHE_DEBUG)
    if (removedFiles > 0) {
        qDebug() << "QNetworkDiskCache::expire()"
                << "Removed:" << removedFiles
                << "Kept:" << cacheItems.count() - removedFiles;
    }
#endif
    return totalSize;
}